

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

DWARFUnit * __thiscall
llvm::DWARFDebugLine::SectionParser::prepareToParse(SectionParser *this,uint64_t Offset)

{
  DWARFDataExtractor *this_00;
  bool bVar1;
  uint8_t Size;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  iterator It;
  DWARFUnit *U;
  uint64_t Offset_local;
  SectionParser *this_local;
  
  It._M_node = (_Base_ptr)0x0;
  U = (DWARFUnit *)Offset;
  Offset_local = (uint64_t)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_llvm::DWARFUnit_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>_>
       ::find(&this->LineToUnit,(key_type_conflict *)&U);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_llvm::DWARFUnit_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>_>
       ::end(&this->LineToUnit);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>::operator->
                       (&local_28);
    It._M_node = (_Base_ptr)ppVar2->second;
  }
  this_00 = this->DebugLineData;
  if (It._M_node == (_Base_ptr)0x0) {
    Size = '\0';
  }
  else {
    Size = DWARFUnit::getAddressByteSize((DWARFUnit *)It._M_node);
  }
  DataExtractor::setAddressSize(&this_00->super_DataExtractor,Size);
  return (DWARFUnit *)It._M_node;
}

Assistant:

DWARFUnit *DWARFDebugLine::SectionParser::prepareToParse(uint64_t Offset) {
  DWARFUnit *U = nullptr;
  auto It = LineToUnit.find(Offset);
  if (It != LineToUnit.end())
    U = It->second;
  DebugLineData.setAddressSize(U ? U->getAddressByteSize() : 0);
  return U;
}